

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetTableNum(void *arkode_mem,ARKODE_DIRKTableID itable,ARKODE_ERKTableID etable)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ARKodeButcherTable pAVar4;
  int in_EDX;
  int in_ESI;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  int flag;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  ARKodeButcherTable in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  ARKODE_DIRKTableID in_stack_ffffffffffffffdc;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      ((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (char *)in_stack_ffffffffffffffd0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeARKStepMem *)0xe875bc);
  if (local_4 == 0) {
    *(undefined4 *)((long)&in_stack_ffffffffffffffd0[1].d + 4) = 0;
    *(undefined4 *)&in_stack_ffffffffffffffd0[1].b = 0;
    *(undefined4 *)((long)&in_stack_ffffffffffffffd0[1].b + 4) = 0;
    ARKodeButcherTable_Space
              (*(ARKodeButcherTable *)(in_stack_ffffffffffffffd0 + 2),
               (sunindextype *)&stack0xffffffffffffffc8,(sunindextype *)&stack0xffffffffffffffcc);
    ARKodeButcherTable_Free(in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0[2].q = 0;
    in_stack_ffffffffffffffd0[2].p = 0;
    *(long *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 0x220) =
         *(long *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 0x220) -
         (long)in_stack_ffffffffffffffc8;
    *(long *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 0x218) =
         *(long *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 0x218) -
         (long)in_stack_ffffffffffffffcc;
    ARKodeButcherTable_Space
              (*(ARKodeButcherTable *)&in_stack_ffffffffffffffd0[2].stages,
               (sunindextype *)&stack0xffffffffffffffc8,(sunindextype *)&stack0xffffffffffffffcc);
    ARKodeButcherTable_Free(in_stack_ffffffffffffffd0);
    *(undefined8 *)&in_stack_ffffffffffffffd0[2].stages = 0;
    *(long *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 0x220) =
         *(long *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 0x220) -
         (long)in_stack_ffffffffffffffc8;
    *(long *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 0x218) =
         *(long *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) + 0x218) -
         (long)in_stack_ffffffffffffffcc;
    if ((in_ESI < 0) && (in_EDX < 0)) {
      arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),-0x15
                      ,"ARKode::ARKStep","ARKStepSetTableNum",
                      "At least one valid table number must be supplied");
      local_4 = -0x16;
    }
    else {
      if (in_ESI < 0) {
        if ((in_EDX < 0) || (0xe < in_EDX)) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x15,"ARKode::ARKStep","ARKStepSetTableNum","Illegal ERK table number");
          return -0x16;
        }
        pAVar4 = ARKodeButcherTable_LoadERK(in_stack_ffffffffffffffdc);
        *(ARKodeButcherTable *)(in_stack_ffffffffffffffd0 + 2) = pAVar4;
        lVar1._0_4_ = in_stack_ffffffffffffffd0[2].q;
        lVar1._4_4_ = in_stack_ffffffffffffffd0[2].p;
        if (lVar1 == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x15,"ARKode::ARKStep","ARKStepSetTableNum",
                          "Error setting explicit table with that index");
          return -0x16;
        }
        *(undefined4 *)((long)&in_stack_ffffffffffffffd0[1].d + 4) =
             *(undefined4 *)(*(long *)(in_stack_ffffffffffffffd0 + 2) + 8);
        *(undefined4 *)&in_stack_ffffffffffffffd0[1].b =
             **(undefined4 **)(in_stack_ffffffffffffffd0 + 2);
        *(undefined4 *)((long)&in_stack_ffffffffffffffd0[1].b + 4) =
             *(undefined4 *)(*(long *)(in_stack_ffffffffffffffd0 + 2) + 4);
        iVar3 = ARKStepSetExplicit((void *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8));
        if (iVar3 != 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x16,"ARKode::ARKStep","ARKStepSetTableNum","Error in ARKStepSetExplicit"
                         );
          return iVar3;
        }
      }
      else if (in_EDX < 0) {
        if ((in_ESI < 100) || (0x71 < in_ESI)) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x15,"ARKode::ARKStep","ARKStepSetTableNum","Illegal IRK table number");
          return -0x16;
        }
        pAVar4 = ARKodeButcherTable_LoadDIRK(in_stack_ffffffffffffffdc);
        *(ARKodeButcherTable *)&in_stack_ffffffffffffffd0[2].stages = pAVar4;
        if (*(long *)&in_stack_ffffffffffffffd0[2].stages == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x15,"ARKode::ARKStep","ARKStepSetTableNum",
                          "Error setting table with that index");
          return -0x16;
        }
        *(undefined4 *)((long)&in_stack_ffffffffffffffd0[1].d + 4) =
             *(undefined4 *)(*(long *)&in_stack_ffffffffffffffd0[2].stages + 8);
        *(undefined4 *)&in_stack_ffffffffffffffd0[1].b =
             **(undefined4 **)&in_stack_ffffffffffffffd0[2].stages;
        *(undefined4 *)((long)&in_stack_ffffffffffffffd0[1].b + 4) =
             *(undefined4 *)(*(long *)&in_stack_ffffffffffffffd0[2].stages + 4);
        iVar3 = ARKStepSetImplicit((void *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8));
        if (iVar3 != 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x16,"ARKode::ARKStep","ARKStepSetTableNum","Error in ARKStepSetImplicit"
                         );
          return iVar3;
        }
      }
      else {
        if ((((((in_EDX != 2) || (in_ESI != 0x68)) && ((in_EDX != 4 || (in_ESI != 0x6d)))) &&
             ((in_EDX != 0xd || (in_ESI != 0x70)))) && ((in_EDX != 9 || (in_ESI != 0x6f)))) &&
           ((in_EDX != 0xe || (in_ESI != 0x71)))) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x16,"ARKode::ARKStep","ARKStepSetTableNum",
                          "Incompatible Butcher tables for ARK method");
          return -0x16;
        }
        pAVar4 = ARKodeButcherTable_LoadDIRK(in_stack_ffffffffffffffdc);
        *(ARKodeButcherTable *)&in_stack_ffffffffffffffd0[2].stages = pAVar4;
        pAVar4 = ARKodeButcherTable_LoadERK(in_stack_ffffffffffffffdc);
        *(ARKodeButcherTable *)(in_stack_ffffffffffffffd0 + 2) = pAVar4;
        if (*(long *)&in_stack_ffffffffffffffd0[2].stages == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x15,"ARKode::ARKStep","ARKStepSetTableNum","Illegal IRK table number");
          return -0x16;
        }
        lVar2._0_4_ = in_stack_ffffffffffffffd0[2].q;
        lVar2._4_4_ = in_stack_ffffffffffffffd0[2].p;
        if (lVar2 == 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x15,"ARKode::ARKStep","ARKStepSetTableNum","Illegal ERK table number");
          return -0x16;
        }
        *(undefined4 *)((long)&in_stack_ffffffffffffffd0[1].d + 4) =
             *(undefined4 *)(*(long *)&in_stack_ffffffffffffffd0[2].stages + 8);
        *(undefined4 *)&in_stack_ffffffffffffffd0[1].b =
             **(undefined4 **)&in_stack_ffffffffffffffd0[2].stages;
        *(undefined4 *)((long)&in_stack_ffffffffffffffd0[1].b + 4) =
             *(undefined4 *)(*(long *)&in_stack_ffffffffffffffd0[2].stages + 4);
        iVar3 = ARKStepSetImEx((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                              );
        if (iVar3 != 0) {
          arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          -0x16,"ARKode::ARKStep","ARKStepSetTableNum",
                          "Cannot specify that method is ImEx without providing function pointers to fi(t,y) and fe(t,y)."
                         );
          return -0x16;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetTableNum(void *arkode_mem, ARKODE_DIRKTableID itable, ARKODE_ERKTableID etable)
{
  int flag, retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetTableNum",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /* determine mode (implicit/explicit/ImEx), and perform
     appropriate actions  */

  /*     illegal inputs */
  if ((itable < 0) && (etable < 0)) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetTableNum",
                    "At least one valid table number must be supplied");
    return(ARK_ILL_INPUT);


  /* explicit */
  } else if (itable < 0) {

    /* check that argument specifies an explicit table */
    if (etable<ARKODE_MIN_ERK_NUM || etable>ARKODE_MAX_ERK_NUM) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Illegal ERK table number");
      return(ARK_ILL_INPUT);
    }

    /* fill in table based on argument */
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Error setting explicit table with that index");
      return(ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Be->stages;
    step_mem->q = step_mem->Be->q;
    step_mem->p = step_mem->Be->p;

    /* set method as purely explicit */
    flag = ARKStepSetExplicit(arkode_mem);
    if (flag != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Error in ARKStepSetExplicit");
      return(flag);
    }


  /* implicit */
  } else if (etable < 0) {

    /* check that argument specifies an implicit table */
    if (itable<ARKODE_MIN_DIRK_NUM || itable>ARKODE_MAX_DIRK_NUM) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Illegal IRK table number");
      return(ARK_ILL_INPUT);
    }

    /* fill in table based on argument */
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Error setting table with that index");
      return(ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q = step_mem->Bi->q;
    step_mem->p = step_mem->Bi->p;

    /* set method as purely implicit */
    flag = ARKStepSetImplicit(arkode_mem);
    if (flag != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Error in ARKStepSetImplicit");
      return(flag);
    }


  /* ImEx */
  } else {

    /* ensure that tables match */
    if ( !((etable == ARKODE_ARK324L2SA_ERK_4_2_3) && (itable == ARKODE_ARK324L2SA_DIRK_4_2_3)) &&
         !((etable == ARKODE_ARK436L2SA_ERK_6_3_4) && (itable == ARKODE_ARK436L2SA_DIRK_6_3_4)) &&
         !((etable == ARKODE_ARK437L2SA_ERK_7_3_4) && (itable == ARKODE_ARK437L2SA_DIRK_7_3_4)) &&
         !((etable == ARKODE_ARK548L2SA_ERK_8_4_5) && (itable == ARKODE_ARK548L2SA_DIRK_8_4_5)) &&
         !((etable == ARKODE_ARK548L2SAb_ERK_8_4_5) && (itable == ARKODE_ARK548L2SAb_DIRK_8_4_5)) ) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Incompatible Butcher tables for ARK method");
      return(ARK_ILL_INPUT);
    }

    /* fill in tables based on arguments */
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Illegal IRK table number");
      return(ARK_ILL_INPUT);
    }
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTableNum",
                      "Illegal ERK table number");
      return(ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q = step_mem->Bi->q;
    step_mem->p = step_mem->Bi->p;

    /* set method as ImEx */
    if (ARKStepSetImEx(arkode_mem) != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTableNum", MSG_ARK_MISSING_F);
      return(ARK_ILL_INPUT);
    }

  }

  return(ARK_SUCCESS);
}